

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_1_n<3>
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  int iVar1;
  bool bVar2;
  int32_t sum2;
  int32_t sum1;
  int32_t sum0;
  uint32_t local_40;
  uint32_t local_3c;
  ymfm_output<3> *local_38;
  
  local_40 = numsamples;
  for (local_3c = 0; local_3c != local_40; local_3c = local_3c + 1) {
    sum0 = 0;
    sum1 = 0;
    sum2 = 0;
    iVar1 = 3;
    local_38 = output;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      clock_and_add(this,&sum0,&sum1,&sum2,1);
    }
    local_38->data[2] = ((sum1 + sum0 + sum2) * 2) / 9;
    this->m_sampindex = this->m_sampindex + 1;
    output = local_38 + 1;
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_1_n(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		for (int rep = 0; rep < Divisor; rep++)
			clock_and_add(sum0, sum1, sum2);
		write_to_output(output, sum0, sum1, sum2, Divisor);
	}
}